

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 SyStrToInt32(char *zSrc,sxu32 nLen,void *pOutVal,char **zRest)

{
  char cVar1;
  sxi32 sVar2;
  int iVar3;
  ushort **ppuVar4;
  ushort *puVar5;
  short sVar6;
  long lVar7;
  char *pcVar8;
  char *pB1;
  short sVar9;
  char *pcVar10;
  long lVar11;
  char *pcVar12;
  bool bVar13;
  int local_70;
  short local_58;
  short local_50;
  short local_48;
  
  pcVar10 = zSrc + nLen;
  for (pcVar12 = zSrc; pcVar12 < pcVar10; pcVar12 = pcVar12 + 1) {
    ppuVar4 = __ctype_b_loc();
    cVar1 = *pcVar12;
    if ((*(byte *)((long)*ppuVar4 + (long)cVar1 * 2 + 1) & 0x20) == 0) {
      if ((cVar1 == '+') || (cVar1 == '-')) {
        bVar13 = cVar1 == '-';
        pcVar12 = pcVar12 + 1;
        goto LAB_0011f761;
      }
      break;
    }
  }
  bVar13 = false;
LAB_0011f761:
  for (lVar7 = 0; (pB1 = pcVar12 + lVar7, pB1 < pcVar10 && (*pB1 == '0')); lVar7 = lVar7 + 1) {
  }
  sVar6 = 10;
  if (9 < (((int)zSrc + nLen) - (int)pcVar12) - (int)lVar7) {
    pcVar8 = "2147483648";
    if (!bVar13) {
      pcVar8 = "2147483647";
    }
    sVar2 = SyMemcmp(pB1,pcVar8,nLen);
    sVar6 = (sVar2 < 1) + 9;
  }
  local_58 = sVar6 + -3;
  local_50 = sVar6 + -2;
  local_48 = sVar6 + -1;
  lVar11 = 0;
  puVar5 = (ushort *)0x0;
  while( true ) {
    local_70 = (int)puVar5;
    pcVar8 = pB1;
    if ((pcVar10 <= pcVar12 + lVar11 + lVar7) || (sVar9 = (short)lVar11, sVar6 == sVar9))
    goto LAB_0011f91d;
    ppuVar4 = __ctype_b_loc();
    puVar5 = *ppuVar4;
    pcVar8 = pcVar12 + lVar11 + lVar7;
    if ((*(byte *)((long)puVar5 + (long)pcVar12[lVar7 + lVar11] * 2 + 1) & 8) == 0)
    goto LAB_0011f91d;
    local_70 = local_70 * 10 + (int)pcVar12[lVar7 + lVar11] + -0x30;
    if ((pcVar10 <= pcVar12 + lVar11 + lVar7 + 1) || (local_48 == sVar9)) break;
    if ((*(byte *)((long)puVar5 + (long)pcVar12[lVar7 + lVar11 + 1] * 2 + 1) & 8) == 0) {
      pcVar8 = pB1 + 1;
      goto LAB_0011f91d;
    }
    local_70 = local_70 * 10 + (int)pcVar12[lVar7 + lVar11 + 1] + -0x30;
    if ((pcVar10 <= pcVar12 + lVar11 + lVar7 + 2) || (local_50 == sVar9)) {
      pcVar8 = pcVar12 + lVar11 + lVar7 + 2;
      goto LAB_0011f91d;
    }
    if ((*(byte *)((long)puVar5 + (long)pcVar12[lVar7 + lVar11 + 2] * 2 + 1) & 8) == 0) {
      pcVar8 = pB1 + 2;
      goto LAB_0011f91d;
    }
    local_70 = local_70 * 10 + (int)pcVar12[lVar7 + lVar11 + 2] + -0x30;
    pcVar8 = pB1 + 3;
    if ((pcVar10 <= pcVar12 + lVar11 + lVar7 + 3) || (local_58 == sVar9)) goto LAB_0011f91d;
    if ((*(byte *)((long)puVar5 + (long)pcVar12[lVar7 + lVar11 + 3] * 2 + 1) & 8) == 0) {
      pcVar8 = pcVar12 + lVar11 + lVar7 + 3;
      goto LAB_0011f91d;
    }
    puVar5 = (ushort *)(ulong)((local_70 * 10 + (int)pcVar12[lVar7 + lVar11 + 3]) - 0x30);
    pB1 = pB1 + 4;
    lVar11 = lVar11 + 4;
  }
  pcVar8 = pcVar12 + lVar11 + lVar7 + 1;
LAB_0011f91d:
  do {
    if (pcVar10 <= pcVar8) break;
    ppuVar4 = __ctype_b_loc();
    puVar5 = *ppuVar4;
    cVar1 = *pcVar8;
    pcVar8 = pcVar8 + 1;
  } while ((*(byte *)((long)puVar5 + (long)cVar1 * 2 + 1) & 0x20) != 0);
  iVar3 = (int)puVar5;
  if (pOutVal != (void *)0x0) {
    iVar3 = -local_70;
    if (local_70 == 0) {
      iVar3 = local_70;
    }
    if (!bVar13) {
      iVar3 = local_70;
    }
    *(int *)pOutVal = iVar3;
  }
  return iVar3;
}

Assistant:

JX9_PRIVATE sxi32 SyStrToInt32(const char *zSrc, sxu32 nLen, void * pOutVal, const char **zRest)
{
	int isNeg = FALSE;
	const char *zEnd;
	sxi32 nVal = 0;
	sxi16 i;
#if defined(UNTRUST)
	if( SX_EMPTY_STR(zSrc) ){
		if( pOutVal ){
			*(sxi32 *)pOutVal = 0;
		}
		return SXERR_EMPTY;
	}
#endif
	zEnd = &zSrc[nLen];
	while(zSrc < zEnd && SyisSpace(zSrc[0]) ){
		zSrc++;
	}
	if( zSrc < zEnd && ( zSrc[0] == '-' || zSrc[0] == '+' ) ){
		isNeg = (zSrc[0] == '-') ? TRUE :FALSE;
		zSrc++;
	}
	/* Skip leading zero */
	while(zSrc < zEnd && zSrc[0] == '0' ){
		zSrc++; 
	}
	i = 10;
	if( (sxu32)(zEnd-zSrc) >= 10 ){
		/* Handle overflow */
		i = SyMemcmp(zSrc, (isNeg == TRUE) ? SXINT32_MIN_STR : SXINT32_MAX_STR, nLen) <= 0 ? 10 : 9; 
	}
	for(;;){
		if(zSrc >= zEnd || !i || !SyisDigit(zSrc[0])){ break; } nVal = nVal * 10 + ( zSrc[0] - '0' ) ; --i ; zSrc++;
		if(zSrc >= zEnd || !i || !SyisDigit(zSrc[0])){ break; } nVal = nVal * 10 + ( zSrc[0] - '0' ) ; --i ; zSrc++;
		if(zSrc >= zEnd || !i || !SyisDigit(zSrc[0])){ break; } nVal = nVal * 10 + ( zSrc[0] - '0' ) ; --i ; zSrc++;
		if(zSrc >= zEnd || !i || !SyisDigit(zSrc[0])){ break; } nVal = nVal * 10 + ( zSrc[0] - '0' ) ; --i ; zSrc++;
	}
	/* Skip trailing spaces */
	while(zSrc < zEnd && SyisSpace(zSrc[0])){
		zSrc++;
	}
	if( zRest ){
		*zRest = (char *)zSrc;
	}	
	if( pOutVal ){
		if( isNeg == TRUE && nVal != 0 ){
			nVal = -nVal;
		}
		*(sxi32 *)pOutVal = nVal;
	}
	return (zSrc >= zEnd) ? SXRET_OK : SXERR_SYNTAX;
}